

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_bdecode.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_libtorrent::lazy_entry_*>
* __thiscall
libtorrent::lazy_entry::dict_at_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_libtorrent::lazy_entry_*>
           *__return_storage_ptr__,lazy_entry *this,int i)

{
  char *pcVar1;
  char *pcVar2;
  lazy_entry *local_68 [3];
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  lazy_dict_entry *local_28;
  lazy_dict_entry *e;
  lazy_entry *plStack_18;
  int i_local;
  lazy_entry *this_local;
  
  local_28 = (this->m_data).dict + (i + 1);
  pcVar1 = local_28->name;
  pcVar2 = (local_28->val).m_begin;
  e._4_4_ = i;
  plStack_18 = this;
  this_local = (lazy_entry *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,pcVar1,(long)pcVar2 - (long)pcVar1,&local_49);
  local_68[0] = &local_28->val;
  std::make_pair<std::__cxx11::string,libtorrent::lazy_entry_const*>
            (__return_storage_ptr__,&local_48,local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, lazy_entry const*> lazy_entry::dict_at(int const i) const
	{
		TORRENT_ASSERT(m_type == dict_t);
		TORRENT_ASSERT(i < int(m_size));
		lazy_dict_entry const& e = m_data.dict[i + 1];
		TORRENT_ASSERT(e.val.m_begin >= e.name);
		return std::make_pair(std::string(e.name, std::size_t(e.val.m_begin - e.name)), &e.val);
	}